

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O3

void testReadBadFiles(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  char *in_RCX;
  string fn;
  exr_context_t f;
  long *local_b0 [2];
  long local_a0 [2];
  undefined1 local_90 [8];
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  std::__cxx11::string::append((char *)local_b0);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_28 = 0;
  local_88 = 0x68;
  uStack_30 = 0xbf800000fffffffe;
  local_80 = err_cb;
  iVar1 = exr_start_read(local_90,local_b0[0]);
  if (iVar1 == 6) {
    iVar1 = exr_test_file_header("somenonexistentexrfile.exr",&local_88);
    if (iVar1 == 5) {
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(5);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141fc7;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(6);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x6f,0x34aee6,in_RCX);
  }
  sVar4 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00141fc7:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_test_file_header (\"somenonexistentexrfile.exr\", &cinit)",(char *)0x73,
                 0x34aee6,in_RCX);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}